

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_5bbd1::PyListCtrlPMatchSource<cpsm::FilenameOnlyMatch>::fill
          (PyListCtrlPMatchSource<cpsm::FullLineMatch> *this,
          vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
          *items)

{
  long lVar1;
  bool bVar2;
  Py_ssize_t PVar3;
  long *plVar4;
  PyObject *in_RSI;
  long in_RDI;
  Py_ssize_t max;
  anon_class_8_1_a817d6e0 add_item;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  long local_40;
  long local_38;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  bool local_1;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
             ,in_stack_ffffffffffffff88);
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    lVar1 = *(long *)(in_RDI + 0x30);
    PVar3 = batch_size();
    local_40 = lVar1 + PVar3;
    plVar4 = std::min<long>(&local_40,(long *)(in_RDI + 0x38));
    local_38 = *plVar4;
    while (*(long *)(in_RDI + 0x30) < local_38) {
      PyList_GetItem(*(undefined8 *)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x30));
      bVar2 = fill::anon_class_8_1_a817d6e0::operator()
                        ((anon_class_8_1_a817d6e0 *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RSI);
      if (!bVar2) {
        *(undefined1 *)(in_RDI + 0x40) = 1;
        local_1 = false;
        goto LAB_00158feb;
      }
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    }
    local_1 = *(long *)(in_RDI + 0x30) != *(long *)(in_RDI + 0x38);
  }
  else {
    local_1 = false;
  }
LAB_00158feb:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x158ff5);
  return local_1;
}

Assistant:

bool fill(std::vector<Item>& items) {
    std::lock_guard<std::mutex> lock(mu_);
    if (done_) {
      return false;
    }
    auto const add_item = [&](PyObject* item_obj) {
      if (item_obj == nullptr) {
        return false;
      }
      char* item_data;
      Py_ssize_t item_size;
      if (!PyVimString_AsStringAndSize(item_obj, &item_data, &item_size)) {
        return false;
      }
      items.emplace_back(
          cpsm::CtrlPItem<cpsm::StringRefItem, MatchMode>(
              (cpsm::StringRefItem(boost::string_ref(item_data, item_size)))),
          item_obj);
      return true;
    };
    Py_ssize_t const max = std::min(i_ + batch_size(), size_);
    for (; i_ < max; i_++) {
      if (!add_item(PyList_GetItem(list_, i_))) {
        done_ = true;
        return false;
      }
    }
    return i_ != size_;
  }